

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<float>
          (internal *this,char *expected_expression,char *actual_expression,float expected,
          float actual)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  string local_3a0;
  string local_380;
  int local_35c;
  stringstream local_358 [8];
  stringstream actual_ss;
  ostream local_348 [396];
  int local_1bc;
  stringstream local_1b8 [8];
  stringstream expected_ss;
  ostream local_1a8 [376];
  FloatingPoint<float> local_30;
  FloatingPoint<float> local_2c;
  FloatingPoint<float> rhs;
  FloatingPoint<float> lhs;
  float actual_local;
  float expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  rhs.u_ = (FloatingPointUnion)actual;
  lhs.u_ = (FloatingPointUnion)expected;
  FloatingPoint<float>::FloatingPoint(&local_2c,(float *)&lhs);
  FloatingPoint<float>::FloatingPoint(&local_30,(float *)&rhs);
  bVar1 = FloatingPoint<float>::AlmostEquals(&local_2c,&local_30);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1bc = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_1a8,(_Setprecision)local_1bc);
    std::ostream::operator<<(poVar2,(float)lhs.u_);
    std::__cxx11::stringstream::stringstream(local_358);
    local_35c = (int)std::setprecision(8);
    poVar2 = std::operator<<(local_348,(_Setprecision)local_35c);
    std::ostream::operator<<(poVar2,(float)rhs.u_);
    StringStreamToString(&local_380,(stringstream *)local_1b8);
    StringStreamToString(&local_3a0,(stringstream *)local_358);
    EqFailure(this,expected_expression,actual_expression,&local_380,&local_3a0,false);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::stringstream::~stringstream(local_358);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* expected_expression,
                                         const char* actual_expression,
                                         RawType expected,
                                         RawType actual) {
  const FloatingPoint<RawType> lhs(expected), rhs(actual);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream expected_ss;
  expected_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
              << expected;

  ::std::stringstream actual_ss;
  actual_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
            << actual;

  return EqFailure(expected_expression,
                   actual_expression,
                   StringStreamToString(&expected_ss),
                   StringStreamToString(&actual_ss),
                   false);
}